

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
* __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
::operator=(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
            *this,Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
                  *other)

{
  const_iterator first;
  const_iterator last;
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::KeyValuePair>
  local_28;
  
  if (this != other) {
    clear(this);
    local_28.m_ = other->elements_;
    InnerMap::
    iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::KeyValuePair>
    ::SearchFrom(&local_28,(local_28.m_)->index_of_first_non_null_);
    first.it_.m_ = local_28.m_;
    first.it_.node_ = local_28.node_;
    first.it_.bucket_index_ = local_28.bucket_index_;
    last.it_.bucket_index_ = 0;
    last.it_.node_ = (Node *)0x0;
    last.it_.m_ = (InnerMap *)0x0;
    Map<std::__cxx11::string,CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::
    insert<google::protobuf::Map<std::__cxx11::string,CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::const_iterator>
              ((Map<std::__cxx11::string,CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
                *)this,first,last);
  }
  return this;
}

Assistant:

Map& operator=(const Map& other) {
    if (this != &other) {
      clear();
      insert(other.begin(), other.end());
    }
    return *this;
  }